

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

DataModel * __thiscall Rml::Context::GetDataModelPtr(Context *this,String *name)

{
  size_t sVar1;
  Node *pNVar2;
  _Head_base<0UL,_Rml::DataModel_*,_false> _Var3;
  
  sVar1 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>
                    ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)&this->data_models,name);
  pNVar2 = (this->data_models).mKeyVals + sVar1;
  if (pNVar2 == (Node *)(this->data_models).mInfo) {
    _Var3._M_head_impl = (DataModel *)0x0;
  }
  else {
    _Var3._M_head_impl =
         (pNVar2->mData).second._M_t.
         super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>._M_t.
         super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
         super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl;
  }
  return _Var3._M_head_impl;
}

Assistant:

DataModel* Context::GetDataModelPtr(const String& name) const
{
	auto it = data_models.find(name);
	if (it != data_models.end())
		return it->second.get();
	return nullptr;
}